

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O1

void __thiscall
QMdi::ControlElement<QMdi::ControlLabel>::~ControlElement(ControlElement<QMdi::ControlLabel> *this)

{
  int *piVar1;
  void *pvVar2;
  
  this[-1].mdiChild.wp.d = (Data *)&PTR_metaObject_00804af0;
  *(undefined ***)&(this->super_ControlLabel).super_QWidget = &PTR__ControlElement_00804ca0;
  piVar1 = *(int **)&(this->super_ControlLabel).field_0x38;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) &&
       (pvVar2 = *(void **)&(this->super_ControlLabel).field_0x38, pvVar2 != (void *)0x0)) {
      operator_delete(pvVar2);
    }
  }
  this[-1].mdiChild.wp.d = (Data *)&PTR_metaObject_00803fe8;
  *(undefined ***)&(this->super_ControlLabel).super_QWidget = &PTR__ControlLabel_00804198;
  QPixmap::~QPixmap((QPixmap *)&(this->super_ControlLabel).super_QWidget.field_0x18);
  QWidget::~QWidget((QWidget *)&this[-1].mdiChild);
  return;
}

Assistant:

ControlElement(QMdiSubWindow *child) : T(nullptr)
    {
        Q_ASSERT(child);
        mdiChild = child;
    }